

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *s,QIcon *icon)

{
  uint uVar1;
  QIconEngine *pQVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(s + 0x18) < 9) {
    if (*(int *)(s + 0x18) == 8) {
      bVar3 = QIcon::isNull(icon);
      if (bVar3) {
        QDataStream::operator<<(s,0);
      }
      else {
        pQVar2 = icon->d->engine;
        uVar1 = *(uint *)&pQVar2[3]._vptr_QIconEngine;
        QDataStream::operator<<(s,uVar1);
        uVar4 = 0;
        uVar5 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar5 = uVar4;
        }
        for (; uVar5 * 0x40 != uVar4; uVar4 = uVar4 + 0x40) {
          operator<<(s,(QPixmap *)((long)pQVar2[2]._vptr_QIconEngine + uVar4));
          operator<<(s,(QString *)((long)pQVar2[2]._vptr_QIconEngine + uVar4 + 0x18));
          operator<<(s,(QSize *)((long)pQVar2[2]._vptr_QIconEngine + uVar4 + 0x30));
          QDataStream::operator<<(s,*(int *)((long)pQVar2[2]._vptr_QIconEngine + uVar4 + 0x38));
          QDataStream::operator<<(s,*(int *)((long)pQVar2[2]._vptr_QIconEngine + uVar4 + 0x3c));
        }
      }
    }
    else {
      QIcon::pixmap((QPixmap *)&local_48,icon,0x16,0x16,Normal,Off);
      operator<<(s,(QPixmap *)&local_48);
      QPixmap::~QPixmap((QPixmap *)&local_48);
    }
  }
  else {
    bVar3 = QIcon::isNull(icon);
    if (bVar3) {
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      operator<<(s,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    else {
      (*icon->d->engine->_vptr_QIconEngine[7])(&local_48);
      operator<<(s,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      pQVar2 = icon->d->engine;
      (*pQVar2->_vptr_QIconEngine[10])(pQVar2,s);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QIcon &icon)
{
    if (s.version() >= QDataStream::Qt_4_3) {
        if (icon.isNull()) {
            s << QString();
        } else {
            s << icon.d->engine->key();
            icon.d->engine->write(s);
        }
    } else if (s.version() == QDataStream::Qt_4_2) {
        if (icon.isNull()) {
            s << 0;
        } else {
            QPixmapIconEngine *engine = static_cast<QPixmapIconEngine *>(icon.d->engine);
            int num_entries = engine->pixmaps.size();
            s << num_entries;
            for (int i=0; i < num_entries; ++i) {
                s << engine->pixmaps.at(i).pixmap;
                s << engine->pixmaps.at(i).fileName;
                s << engine->pixmaps.at(i).size;
                s << (uint) engine->pixmaps.at(i).mode;
                s << (uint) engine->pixmaps.at(i).state;
            }
        }
    } else {
        s << QPixmap(icon.pixmap(22,22));
    }
    return s;
}